

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool __thiscall
ColumnSampler<double>::sample_col
          (ColumnSampler<double> *this,size_t *col,Xoshiro256PP *rnd_generator)

{
  bool bVar1;
  pointer puVar2;
  reference pvVar3;
  reference pvVar4;
  value_type *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  result_type_conflict1 rVar5;
  size_t lev;
  double curr_subrange;
  double w_left;
  double rnd_subrange;
  size_t curr_ix;
  Xoshiro256PP *in_stack_ffffffffffffff88;
  Xoshiro256PP *__urng;
  pointer local_58;
  size_type local_38;
  bool local_1;
  
  bVar1 = has_weights((ColumnSampler<double> *)0x223a22);
  if (bVar1) {
    local_38 = 0;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),0);
    if (0.0 < *pvVar4) {
      for (local_58 = (pointer)0x0;
          local_58 <
          in_RDI[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; local_58 = (pointer)((long)local_58 + 1)) {
        std::uniform_real_distribution<double>::uniform_real_distribution
                  ((uniform_real_distribution<double> *)in_RDI,(double)in_stack_ffffffffffffff88,
                   1.10837995296121e-317);
        rVar5 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)in_RDI,in_stack_ffffffffffffff88);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),local_38 * 2 + 1
                           );
        local_38 = local_38 * 2 + 1 + (ulong)(*pvVar4 <= rVar5);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),local_38);
      }
      *in_RSI = local_38 -
                (long)in_RDI[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    __urng = (Xoshiro256PP *)
             in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (__urng == (Xoshiro256PP *)0x0) {
      local_1 = false;
    }
    else if (__urng == (Xoshiro256PP *)0x1) {
      in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,0);
      *in_RSI = *pvVar3;
      local_1 = true;
    }
    else {
      std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
                ((uniform_int_distribution<unsigned_long> *)in_RDI,(unsigned_long)__urng,0x223a9a);
      puVar2 = (pointer)std::uniform_int_distribution<unsigned_long>::operator()
                                  ((uniform_int_distribution<unsigned_long> *)in_RDI,__urng);
      in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar2;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDI,(size_type)
                                 in_RDI[2].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      *in_RSI = *pvVar3;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ColumnSampler<ldouble_safe>::sample_col(size_t &col, RNG_engine &rnd_generator)
{
    if (!this->has_weights())
    {
        switch(this->curr_pos)
        {
            case 0: return false;
            case 1:
            {
                this->last_given = 0;
                col = this->col_indices[0];
                return true;
            }
            default:
            {
                this->last_given = std::uniform_int_distribution<size_t>(0, this->curr_pos-1)(rnd_generator);
                col = this->col_indices[this->last_given];
                return true;
            }
        }
    }

    else
    {
        /* TODO: here could instead generate only 1 random number from zero to the full weight,
           and then subtract from it as it goes down every level. Would have less precision
           but should still work fine. */
        size_t curr_ix = 0;
        double rnd_subrange, w_left;
        double curr_subrange = this->tree_weights[0];
        if (curr_subrange <= 0)
            return false;

        for (size_t lev = 0; lev < tree_levels; lev++)
        {
            rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
            w_left = this->tree_weights[ix_child(curr_ix)];
            curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
            curr_subrange = this->tree_weights[curr_ix];
        }

        col = curr_ix - this->offset;
        return true;
    }
}